

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O1

vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
* vkt::tessellation::readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
            (vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             *__return_storage_ptr__,int count,void *memory,int offset,int stride)

{
  pointer __s;
  pointer pPVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *this;
  
  if (-1 < count) {
    this = (_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            *)(long)count;
    (__return_storage_ptr__->
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __s = std::
          _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::_M_allocate(this,CONCAT44(in_register_00000034,count));
    (__return_storage_ptr__->
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    )._M_impl.super__Vector_impl_data._M_start = __s;
    (__return_storage_ptr__->
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    )._M_impl.super__Vector_impl_data._M_finish = __s;
    (__return_storage_ptr__->
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = __s + (long)this;
    pPVar1 = __s;
    if (count != 0) {
      memset(__s,0,(long)this * 0x40);
      pPVar1 = __s + (long)this;
    }
    (__return_storage_ptr__->
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    )._M_impl.super__Vector_impl_data._M_finish = pPVar1;
    if (count != 0) {
      uVar2 = 1;
      if (1 < count) {
        uVar2 = (ulong)(uint)count;
      }
      memcpy(__s,(void *)((long)memory + (long)offset),uVar2 << 6);
    }
    return __return_storage_ptr__;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

std::vector<T> readInterleavedData (const int count, const void* memory, const int offset, const int stride)
{
	std::vector<T> results(count);
	const deUint8* pData = static_cast<const deUint8*>(memory) + offset;

	for (int i = 0; i < count; ++i)
	{
		deMemcpy(&results[i], pData, sizeof(T));
		pData += stride;
	}

	return results;
}